

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

SMatrix<double,_3,_3> * __thiscall
gmath::transpose<double,3,3>
          (SMatrix<double,_3,_3> *__return_storage_ptr__,gmath *this,SMatrix<double,_3,_3> *a)

{
  int k;
  long lVar1;
  double (*padVar2) [3];
  gmath *pgVar3;
  long lVar4;
  
  SMatrix<double,_3,_3>::SMatrix(__return_storage_ptr__);
  padVar2 = (double (*) [3])__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    pgVar3 = this;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      (*(double (*) [3])*padVar2)[lVar4] = *(double *)pgVar3;
      pgVar3 = pgVar3 + 0x18;
    }
    padVar2 = padVar2 + 1;
    this = this + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

inline SMatrix<T, nrows, ncols> transpose(
  const SMatrix<T, ncols, nrows> &a)
{
  SMatrix<T, nrows, ncols> ret;

  for (int k=0; k<nrows; k++)
    for (int i=0; i<ncols; i++)
    {
      ret(k, i)=a(i, k);
    }

  return ret;
}